

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneT.cpp
# Opt level: O0

void __thiscall
PermutazioneT::randomSS
          (PermutazioneT *this,PermutazioneT *p,unsigned_short *spostamenti,double F,Coppia *coppie)

{
  ushort uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  double dVar9;
  int lc2;
  int lc1;
  int t;
  int psum;
  int nexc;
  int r;
  int lim;
  int nit;
  int k;
  int j;
  int i;
  unsigned_short nc;
  unsigned_short nc1;
  bool *v;
  unsigned_short *lc;
  unsigned_short **c;
  Coppia *coppie_local;
  double F_local;
  unsigned_short *spostamenti_local;
  PermutazioneT *p_local;
  PermutazioneT *this_local;
  
  auVar3 = ZEXT216((p->super_Permutazione).dimensione) * ZEXT816(8);
  uVar7 = auVar3._0_8_;
  if (auVar3._8_8_ != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  c = (unsigned_short **)coppie;
  coppie_local = (Coppia *)F;
  F_local = (double)spostamenti;
  spostamenti_local = (unsigned_short *)p;
  p_local = this;
  lc = (unsigned_short *)operator_new__(uVar7);
  uVar7 = SUB168(ZEXT216(spostamenti_local[8]) * ZEXT816(2),0);
  if (SUB168(ZEXT216(spostamenti_local[8]) * ZEXT816(2),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  v = (bool *)operator_new__(uVar7);
  _i = operator_new__((ulong)spostamenti_local[8]);
  memset(_i,0,(ulong)spostamenti_local[8]);
  memset(v,0,(ulong)spostamenti_local[8] << 1);
  j._2_2_ = 0;
  j._0_2_ = 0;
  r = 0;
  t = 0;
  for (k = 0; k < (int)(uint)spostamenti_local[8]; k = k + 1) {
    uVar7 = SUB168(ZEXT216(spostamenti_local[8]) * ZEXT816(2),0);
    if (SUB168(ZEXT216(spostamenti_local[8]) * ZEXT816(2),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    pvVar8 = operator_new__(uVar7);
    *(void **)(lc + (long)k * 4) = pvVar8;
  }
  for (k = 0; k < (int)(uint)spostamenti_local[8]; k = k + 1) {
    if ((*(byte *)((long)_i + (long)k) & 1) == 0) {
      nit = k;
      while (((*(byte *)((long)_i + (long)nit) ^ 0xff) & 1) != 0) {
        lVar2 = *(long *)(lc + (ulong)(ushort)j * 4);
        uVar1 = *(ushort *)(v + (ulong)(ushort)j * 2);
        *(ushort *)(v + (ulong)(ushort)j * 2) = uVar1 + 1;
        *(short *)(lVar2 + (ulong)uVar1 * 2) = (short)nit;
        *(undefined1 *)((long)_i + (long)nit) = 1;
        nit = (int)*(ushort *)(*(long *)(spostamenti_local + 4) + (long)nit * 2);
      }
      j._2_2_ = j._2_2_ + 1;
      if (*(ushort *)(v + (ulong)(ushort)j * 2) < 2) {
        (v + (ulong)(ushort)j * 2)[0] = false;
        (v + (ulong)(ushort)j * 2)[1] = false;
      }
      else {
        t = (int)((uint)*(ushort *)(v + (ulong)(ushort)j * 2) *
                 (*(ushort *)(v + (ulong)(ushort)j * 2) - 1)) / 2 + t;
        j._0_2_ = (ushort)j + 1;
      }
    }
  }
  dVar9 = ceil((double)coppie_local * (double)(int)((uint)spostamenti_local[8] - (uint)j._2_2_));
  *(undefined2 *)F_local = 0;
  for (; (ushort)j != 0 && r < (int)dVar9; r = r + 1) {
    iVar4 = Random::randIntU(&genRand,0,t + -1);
    lc1 = 0;
    lim = 0;
    while ((lim < (int)(uint)(ushort)j &&
           (lc1 = (int)((uint)*(ushort *)(v + (long)lim * 2) * (*(ushort *)(v + (long)lim * 2) - 1))
                  / 2 + lc1, lc1 <= iVar4))) {
      lim = lim + 1;
    }
    Random::dueIndiciRandom(&genRand,(uint)*(ushort *)(v + (long)lim * 2),&k,&nit);
    iVar4 = k;
    *(uint *)(c + *(ushort *)F_local) =
         (uint)*(ushort *)(*(long *)(lc + (long)lim * 4) + (long)k * 2);
    *(uint *)((long)c + (ulong)*(ushort *)F_local * 8 + 4) =
         (uint)*(ushort *)(*(long *)(lc + (long)lim * 4) + (long)nit * 2);
    *(short *)F_local = *(short *)F_local + 1;
    t = t - (int)((uint)*(ushort *)(v + (long)lim * 2) * (*(ushort *)(v + (long)lim * 2) - 1)) / 2;
    if (nit < k) {
      k = nit;
      nit = iVar4;
    }
    iVar4 = (k - nit) + (uint)*(ushort *)(v + (long)lim * 2);
    iVar5 = nit - k;
    if ((iVar4 < 2) || (iVar5 < 2)) {
      if ((iVar4 < 2) || (iVar5 != 1)) {
        if (iVar5 < 2) {
          j._0_2_ = (ushort)j - 1;
          if (lim != (uint)(ushort)j) {
            memcpy(*(void **)(lc + (long)lim * 4),*(void **)(lc + (ulong)(ushort)j * 4),
                   (ulong)*(ushort *)(v + (ulong)(ushort)j * 2) << 1);
            *(undefined2 *)(v + (long)lim * 2) = *(undefined2 *)(v + (ulong)(ushort)j * 2);
          }
        }
        else {
          memmove(*(void **)(lc + (long)lim * 4),
                  (void *)(*(long *)(lc + (long)lim * 4) + (long)(k + 1) * 2),(long)iVar5 << 1);
          *(short *)(v + (long)lim * 2) = (short)iVar5;
          t = (iVar5 * (iVar5 + -1)) / 2 + t;
        }
      }
      else {
        iVar5 = ((uint)*(ushort *)(v + (long)lim * 2) - nit) + -1;
        if (0 < iVar5) {
          memmove((void *)(*(long *)(lc + (long)lim * 4) + (long)(k + 1) * 2),
                  (void *)(*(long *)(lc + (long)lim * 4) + (long)(nit + 1) * 2),(long)iVar5 << 1);
        }
        *(short *)(v + (long)lim * 2) = (short)iVar4;
        t = (iVar4 * (iVar4 + -1)) / 2 + t;
      }
    }
    else {
      memcpy(*(void **)(lc + (ulong)(ushort)j * 4),
             (void *)(*(long *)(lc + (long)lim * 4) + (long)(k + 1) * 2),(long)iVar5 << 1);
      *(short *)(v + (ulong)(ushort)j * 2) = (short)iVar5;
      j._0_2_ = (ushort)j + 1;
      iVar6 = ((uint)*(ushort *)(v + (long)lim * 2) - nit) + -1;
      if (0 < iVar6) {
        memmove((void *)(*(long *)(lc + (long)lim * 4) + (long)(k + 1) * 2),
                (void *)(*(long *)(lc + (long)lim * 4) + (long)(nit + 1) * 2),(long)iVar6 << 1);
      }
      *(short *)(v + (long)lim * 2) = (short)iVar4;
      t = (iVar4 * (iVar4 + -1) + iVar5 * (iVar5 + -1)) / 2 + t;
    }
  }
  if (_i != (void *)0x0) {
    operator_delete__(_i);
  }
  if (v != (bool *)0x0) {
    operator_delete__(v);
  }
  for (k = 0; k < (int)(uint)spostamenti_local[8]; k = k + 1) {
    if (*(void **)(lc + (long)k * 4) != (void *)0x0) {
      operator_delete__(*(void **)(lc + (long)k * 4));
    }
  }
  if (lc != (unsigned_short *)0x0) {
    operator_delete__(lc);
  }
  return;
}

Assistant:

void PermutazioneT::randomSS(PermutazioneT* p, unsigned short& spostamenti, double F, Coppia* coppie) {

	unsigned short** c = new unsigned short*[p->dimensione];
	unsigned short* lc = new unsigned short [p->dimensione];
	bool* v = new bool[p->dimensione];

	memset(v, 0, sizeof(bool) * p->dimensione);
	memset(lc, 0, sizeof(unsigned short) * p->dimensione);

	unsigned short nc1 = 0, nc = 0;

	int i, j, k, nit = 0, lim, r, nexc = 0, psum, t, lc1, lc2;

	for (i = 0; i < p->dimensione; i++) {
		c[i] = new unsigned short[p->dimensione];
	}

	for (i = 0; i < p->dimensione; i++) {
		if (v[i]) continue;
		j = i;
		while (!v[j]) {
			c[nc][lc[nc]++] = j;
			v[j] = true;
			j = p->individuo[j];
		}
		nc1++; 

		if (lc[nc] > 1) {
			nexc += lc[nc] * (lc[nc] - 1) / 2;
			nc++;
		}
		else
			lc[nc] = 0;
	}

	lim = ceil(F * (p->dimensione - nc1)); 

	spostamenti = 0;
	while (nc > 0 && nit < lim) {

		r = genRand.randIntU(0, nexc-1);
		psum = 0;
		for (k = 0; k < nc; k++) {
			psum += lc[k] * (lc[k] - 1) / 2;
			if (r < psum) break;
		}

		genRand.dueIndiciRandom(lc[k], i, j);

		coppie[spostamenti].x = c[k][i];
		coppie[spostamenti].y = c[k][j];
		spostamenti++;

		nexc -= lc[k] * (lc[k] - 1) / 2; 
		if (i > j) {
			t = i;
			i = j;
			j = t;
		}

		lc1 = i - j + lc[k];	
		lc2 = j - i;			

		if (lc1 > 1 && lc2 > 1) { 

			memcpy(c[nc], c[k] + (i + 1), sizeof(unsigned short) * lc2);
			lc[nc] = lc2;
			nc++;
			
			t = lc[k] - j - 1;	
			if (t > 0) memmove(c[k] + (i + 1), c[k] + (j + 1), sizeof(unsigned short) * t);
			lc[k] = lc1;

			nexc += (lc1 * (lc1 - 1) + lc2 * (lc2 - 1)) / 2;	
		}
		else if (lc1 > 1 && lc2 == 1) { 

			t = lc[k] - j - 1;	
			if (t > 0) memmove(c[k] + (i + 1), c[k] + (j + 1), sizeof(unsigned short) * t);
			lc[k] = lc1;
	
			nexc += lc1 * (lc1 - 1) / 2;
		}
		else if (lc2 > 1) { 

			memmove(c[k], c[k] + (i + 1), sizeof(unsigned short) * lc2);
			lc[k] = lc2;
		
			nexc += lc2 * (lc2 - 1) / 2;	
		}
		else { 

			nc--;
			if (k != nc) {
				memcpy(c[k], c[nc], sizeof(unsigned short) * lc[nc]);
				lc[k] = lc[nc];
			}
			
		}

		nit++;
	}
	delete[] v;
	delete[] lc;

	for (i = 0; i < p->dimensione; i++) {
		delete[] c[i];
	}
	delete[] c;
}